

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

ON_UUID __thiscall ON_XMLVariant::AsUuid(ON_XMLVariant *this)

{
  ON_XMLVariantPrivate *pOVar1;
  wchar_t *sUUID;
  ON_UUID OVar2;
  
  pOVar1 = this->_private;
  if (pOVar1->_type == Uuid) {
    return (pOVar1->field_2)._uuid_val;
  }
  if (pOVar1->_type == String) {
    sUUID = ON_wString::operator_cast_to_wchar_t_(&pOVar1->_string_val);
    OVar2 = ON_UuidFromString(sUUID);
    return OVar2;
  }
  return (ON_UUID)ZEXT816((ulong)0);
}

Assistant:

ON_UUID ON_XMLVariant::AsUuid(void) const
{
  switch (_private->_type)
  {
  case Types::String:
    return ON_UuidFromString(_private->_string_val);

  case Types::Uuid:
    return _private->_uuid_val;

  default:
    return ON_nil_uuid;
  }
}